

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O2

int __thiscall
vkt::memory::anon_unknown_0::BufferCopyToImage::verify
          (BufferCopyToImage *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  undefined8 *puVar1;
  DeviceInterface *vkd;
  VkDevice device;
  VkResult result;
  int iVar2;
  int extraout_EAX;
  void *pvVar3;
  undefined4 extraout_var;
  Hex<8UL> *value;
  Hex<8UL> *value_00;
  ulong uVar4;
  VkMemoryPropertyFlags properties;
  RefBase<vk::VkCommandBuffer_s_*> local_2c8;
  ResultCollector *local_2a8;
  VkQueue local_2a0;
  VkPhysicalDevice local_298;
  InstanceInterface *local_290;
  ulong local_288;
  size_t commandIndex_local;
  RefBase<vk::Handle<(vk::HandleType)7>_> local_278;
  RefBase<vk::Handle<(vk::HandleType)8>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  undefined8 local_218;
  undefined4 local_210;
  undefined8 local_20c;
  undefined4 local_204;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  deUint64 local_1e0;
  undefined8 local_1d8;
  undefined8 local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined8 local_1a8;
  deUint64 local_1a0;
  undefined4 local_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 local_188;
  string local_178;
  ulong local_158;
  string local_150;
  ulong local_130;
  string local_128;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  
  local_2a8 = *(ResultCollector **)(ctx + 8);
  puVar1 = *(undefined8 **)(ctx + 0x10);
  local_290 = (InstanceInterface *)*puVar1;
  vkd = (DeviceInterface *)puVar1[1];
  local_298 = (VkPhysicalDevice)puVar1[2];
  device = (VkDevice)puVar1[3];
  local_2a0 = (VkQueue)puVar1[4];
  commandIndex_local = (size_t)sig;
  createBeginCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&local_1c8,vkd,device,(VkCommandPool)puVar1[9],
             (VkCommandBufferLevel)tbs);
  local_2c8.m_data.deleter.m_device = (VkDevice)local_1c8.field_2._M_allocated_capacity;
  local_2c8.m_data.deleter.m_pool.m_internal = local_1c8.field_2._8_8_;
  local_2c8.m_data.object = (VkCommandBuffer_s *)local_1c8._M_dataplus._M_p;
  local_2c8.m_data.deleter.m_deviceIface = (DeviceInterface *)local_1c8._M_string_length;
  local_1c8._M_dataplus._M_p = (pointer)0x0;
  local_1c8._M_string_length = 0;
  local_1c8.field_2._M_allocated_capacity = 0;
  local_1c8.field_2._8_8_ = 0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&local_1c8);
  this_00 = &local_48;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(*(long *)(ctx + 0x10) + 0x70));
  createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&local_1c8,vkd,device,
               (long)(this->m_imageWidth * this->m_imageHeight * 4),2,VK_SHARING_MODE_EXCLUSIVE,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
  properties = (VkMemoryPropertyFlags)this_00;
  local_258.m_data.deleter.m_device = (VkDevice)local_1c8.field_2._M_allocated_capacity;
  local_258.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_1c8.field_2._8_8_;
  local_258.m_data.object.m_internal = (deUint64)local_1c8._M_dataplus._M_p;
  local_258.m_data.deleter.m_deviceIface = (DeviceInterface *)local_1c8._M_string_length;
  local_1c8._M_dataplus._M_p = (pointer)0x0;
  local_1c8._M_string_length = 0;
  local_1c8.field_2._M_allocated_capacity = 0;
  local_1c8.field_2._8_8_ = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&local_1c8);
  bindBufferMemory((Move<vk::Handle<(vk::HandleType)7>_> *)&local_1c8,local_290,vkd,local_298,device
                   ,(VkBuffer)local_258.m_data.object.m_internal,properties);
  local_278.m_data.deleter.m_device = (VkDevice)local_1c8.field_2._M_allocated_capacity;
  local_278.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_1c8.field_2._8_8_;
  local_278.m_data.object.m_internal = (deUint64)local_1c8._M_dataplus._M_p;
  local_278.m_data.deleter.m_deviceIface = (DeviceInterface *)local_1c8._M_string_length;
  local_1c8._M_dataplus._M_p = (pointer)0x0;
  local_1c8._M_string_length = 0;
  local_1c8.field_2._M_allocated_capacity = 0;
  local_1c8.field_2._8_8_ = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)7>_> *)&local_1c8);
  local_1c8._M_dataplus._M_p._0_4_ = 0x2d;
  local_1c8._M_string_length = 0;
  local_1c8.field_2._M_allocated_capacity = 0x80000001000;
  local_1c8.field_2._8_8_ = 0x600000007;
  local_1a8 = 0xffffffffffffffff;
  local_1a0 = (this->m_dstImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
              m_internal;
  local_200._M_dataplus._M_p._0_4_ = 0x2c;
  local_200._M_string_length = 0;
  local_200.field_2._M_allocated_capacity = 0x200000001000;
  local_200.field_2._8_8_ = 0xffffffffffffffff;
  local_1e0 = local_258.m_data.object.m_internal;
  local_1d8 = 0;
  local_1d0 = 0xffffffffffffffff;
  local_238._M_dataplus._M_p = (pointer)0x0;
  local_238._M_string_length = 0;
  local_238.field_2._M_allocated_capacity._0_4_ = 1;
  local_238.field_2._M_allocated_capacity._4_4_ = 0;
  local_238.field_2._8_4_ = 0;
  local_238.field_2._12_4_ = 1;
  local_218 = 0;
  local_198 = 1;
  uStack_194 = 0;
  uStack_190 = 1;
  uStack_18c = 0;
  local_210 = 0;
  local_204 = 1;
  local_20c._0_4_ = this->m_imageWidth;
  local_20c._4_4_ = this->m_imageHeight;
  local_188 = local_204;
  (*vkd->_vptr_DeviceInterface[0x6d])
            (vkd,local_2c8.m_data.object,0x1000,0x1000,0,0,0,0,0,1,&local_1c8);
  (*vkd->_vptr_DeviceInterface[99])
            (vkd,local_2c8.m_data.object,
             (this->m_dstImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
             m_internal,6,local_258.m_data.object.m_internal,1,&local_238);
  (*vkd->_vptr_DeviceInterface[0x6d])
            (vkd,local_2c8.m_data.object,0x1000,0x4000,0,0,0,1,&local_200,0,0);
  result = (*vkd->_vptr_DeviceInterface[0x4a])(vkd,local_2c8.m_data.object);
  ::vk::checkResult(result,"vkd.endCommandBuffer(*commandBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryPipelineBarrierTests.cpp"
                    ,0xa77);
  queueRun(vkd,local_2a0,local_2c8.m_data.object);
  pvVar3 = mapMemory(vkd,device,(VkDeviceMemory)local_278.m_data.object.m_internal,
                     (long)(this->m_imageWidth * this->m_imageHeight * 4));
  ::vk::invalidateMappedMemoryRange
            (vkd,device,(VkDeviceMemory)local_278.m_data.object.m_internal,0,
             (long)(this->m_imageWidth * this->m_imageHeight * 4));
  uVar4 = 0;
  do {
    local_288 = uVar4;
    if ((long)(this->m_imageWidth * this->m_imageHeight * 4) == uVar4) {
LAB_0063413f:
      (*vkd->_vptr_DeviceInterface[8])(vkd,device,local_278.m_data.object.m_internal);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::~RefBase(&local_278);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase(&local_258);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
      ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_2c8);
      return extraout_EAX;
    }
    if (((*(ulong *)(*(long *)(ctx + 0x30) + (uVar4 >> 6) * 8) >> (uVar4 & 0x3f) & 1) != 0) &&
       (*(char *)((long)pvVar3 + uVar4) != *(char *)(*(long *)(ctx + 0x18) + uVar4))) {
      de::toString<unsigned_long>(&local_108,&commandIndex_local);
      std::operator+(&local_e8,&local_108,":");
      iVar2 = (*(this->super_CmdCommand)._vptr_CmdCommand[2])(this);
      std::operator+(&local_c8,&local_e8,(char *)CONCAT44(extraout_var,iVar2));
      std::operator+(&local_a8,&local_c8," Result differs from reference, Expected: ");
      local_130 = (ulong)*(byte *)(*(long *)(ctx + 0x18) + uVar4);
      de::toString<tcu::Format::Hex<8ul>>(&local_128,(de *)&local_130,value);
      std::operator+(&local_88,&local_a8,&local_128);
      std::operator+(&local_68,&local_88,", Got: ");
      local_158 = (ulong)*(byte *)((long)pvVar3 + uVar4);
      de::toString<tcu::Format::Hex<8ul>>(&local_150,(de *)&local_158,value_00);
      std::operator+(&local_238,&local_68,&local_150);
      std::operator+(&local_200,&local_238,", At offset: ");
      de::toString<unsigned_long>(&local_178,&local_288);
      std::operator+(&local_1c8,&local_200,&local_178);
      tcu::ResultCollector::fail(local_2a8,&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_200);
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_108);
      goto LAB_0063413f;
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

void BufferCopyToImage::verify (VerifyContext& context, size_t commandIndex)
{
	tcu::ResultCollector&					resultCollector	(context.getResultCollector());
	ReferenceMemory&						reference		(context.getReference());
	const vk::InstanceInterface&			vki				= context.getContext().getInstanceInterface();
	const vk::DeviceInterface&				vkd				= context.getContext().getDeviceInterface();
	const vk::VkPhysicalDevice				physicalDevice	= context.getContext().getPhysicalDevice();
	const vk::VkDevice						device			= context.getContext().getDevice();
	const vk::VkQueue						queue			= context.getContext().getQueue();
	const vk::VkCommandPool					commandPool		= context.getContext().getCommandPool();
	const vk::Unique<vk::VkCommandBuffer>	commandBuffer	(createBeginCommandBuffer(vkd, device, commandPool, vk::VK_COMMAND_BUFFER_LEVEL_PRIMARY));
	const vector<deUint32>&					queueFamilies	= context.getContext().getQueueFamilies();
	const vk::Unique<vk::VkBuffer>			dstBuffer		(createBuffer(vkd, device, 4 * m_imageWidth * m_imageHeight, vk::VK_BUFFER_USAGE_TRANSFER_DST_BIT, vk::VK_SHARING_MODE_EXCLUSIVE, queueFamilies));
	const vk::Unique<vk::VkDeviceMemory>	memory			(bindBufferMemory(vki, vkd, physicalDevice, device, *dstBuffer, vk::VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT));
	{
		const vk::VkImageMemoryBarrier		imageBarrier	=
		{
			vk::VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,
			DE_NULL,

			vk::VK_ACCESS_TRANSFER_WRITE_BIT,
			vk::VK_ACCESS_TRANSFER_READ_BIT,

			vk::VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
			vk::VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,

			VK_QUEUE_FAMILY_IGNORED,
			VK_QUEUE_FAMILY_IGNORED,

			*m_dstImage,
			{
				vk::VK_IMAGE_ASPECT_COLOR_BIT,
				0,	// Mip level
				1,	// Mip level count
				0,	// Layer
				1	// Layer count
			}
		};
		const vk::VkBufferMemoryBarrier bufferBarrier =
		{
			vk::VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,
			DE_NULL,

			vk::VK_ACCESS_TRANSFER_WRITE_BIT,
			vk::VK_ACCESS_HOST_READ_BIT,

			VK_QUEUE_FAMILY_IGNORED,
			VK_QUEUE_FAMILY_IGNORED,
			*dstBuffer,
			0,
			VK_WHOLE_SIZE
		};

		const vk::VkBufferImageCopy	region =
		{
			0,
			0, 0,
			{
				vk::VK_IMAGE_ASPECT_COLOR_BIT,
				0,	// mipLevel
				0,	// arrayLayer
				1	// layerCount
			},
			{ 0, 0, 0 },
			{
				(deUint32)m_imageWidth,
				(deUint32)m_imageHeight,
				1u
			}
		};

		vkd.cmdPipelineBarrier(*commandBuffer, vk::VK_PIPELINE_STAGE_TRANSFER_BIT, vk::VK_PIPELINE_STAGE_TRANSFER_BIT, (vk::VkDependencyFlags)0, 0, (const vk::VkMemoryBarrier*)DE_NULL, 0, (const vk::VkBufferMemoryBarrier*)DE_NULL, 1, &imageBarrier);
		vkd.cmdCopyImageToBuffer(*commandBuffer, *m_dstImage, vk::VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *dstBuffer, 1, &region);
		vkd.cmdPipelineBarrier(*commandBuffer, vk::VK_PIPELINE_STAGE_TRANSFER_BIT, vk::VK_PIPELINE_STAGE_HOST_BIT, (vk::VkDependencyFlags)0, 0, (const vk::VkMemoryBarrier*)DE_NULL, 1, &bufferBarrier, 0, (const vk::VkImageMemoryBarrier*)DE_NULL);
	}

	VK_CHECK(vkd.endCommandBuffer(*commandBuffer));
	queueRun(vkd, queue, *commandBuffer);

	{
		void* const	ptr		= mapMemory(vkd, device, *memory, 4 * m_imageWidth * m_imageHeight);

		vk::invalidateMappedMemoryRange(vkd, device, *memory, 0,  4 * m_imageWidth * m_imageHeight);

		{
			const deUint8* const	data = (const deUint8*)ptr;

			for (size_t pos = 0; pos < (size_t)( 4 * m_imageWidth * m_imageHeight); pos++)
			{
				if (reference.isDefined(pos))
				{
					if (data[pos] != reference.get(pos))
					{
						resultCollector.fail(
								de::toString(commandIndex) + ":" + getName()
								+ " Result differs from reference, Expected: "
								+ de::toString(tcu::toHex<8>(reference.get(pos)))
								+ ", Got: "
								+ de::toString(tcu::toHex<8>(data[pos]))
								+ ", At offset: "
								+ de::toString(pos));
						break;
					}
				}
			}
		}

		vkd.unmapMemory(device, *memory);
	}
}